

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::SharedVarTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SharedVarTestInstance *this)

{
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar8;
  Handle<(vk::HandleType)19> *pHVar9;
  VkBuffer *pVVar10;
  Handle<(vk::HandleType)22> *pHVar11;
  DescriptorSetUpdateBuilder *this_02;
  ProgramCollection<vk::ProgramBinary> *this_03;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar12;
  Handle<(vk::HandleType)14> *pHVar13;
  Handle<(vk::HandleType)24> *pHVar14;
  VkCommandBuffer_s **ppVVar15;
  Handle<(vk::HandleType)18> *pHVar16;
  VkDeviceSize offset;
  ostream *poVar17;
  IVec3 *this_04;
  allocator<char> local_741;
  string local_740;
  undefined4 local_71c;
  string local_718;
  ostringstream local_6f8 [8];
  ostringstream msg;
  int local_580;
  int local_57c;
  int local_578;
  deUint32 ref;
  deUint32 res;
  int localOffset;
  int globalOffset;
  int groupNdx;
  deUint32 *bufferPtr;
  Allocation *local_558;
  Allocation *bufferAllocation;
  deUint64 local_548;
  deUint64 local_540;
  Move<vk::VkCommandBuffer_s_*> local_538;
  RefData<vk::VkCommandBuffer_s_*> local_518;
  undefined1 local_4f8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4b8;
  undefined1 local_498 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_470 [8];
  VkBufferMemoryBarrier computeFinishBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_428;
  RefData<vk::Handle<(vk::HandleType)18>_> local_408;
  undefined1 local_3e8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_3c0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_3a0;
  undefined1 local_380 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_358;
  Move<vk::Handle<(vk::HandleType)14>_> local_338;
  RefData<vk::Handle<(vk::HandleType)14>_> local_318;
  undefined1 local_2f8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  DescriptorSetUpdateBuilder local_2c8;
  deUint64 local_280;
  undefined1 local_278 [8];
  VkDescriptorBufferInfo descriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_250;
  RefData<vk::Handle<(vk::HandleType)22>_> local_230;
  undefined1 local_210 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_1b8;
  undefined1 local_198 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  DescriptorSetLayoutBuilder local_168;
  Move<vk::Handle<(vk::HandleType)19>_> local_120;
  RefData<vk::Handle<(vk::HandleType)19>_> local_100;
  undefined1 local_e0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_b8;
  undefined1 local_80 [8];
  Buffer buffer;
  VkDeviceSize bufferSizeBytes;
  int workGroupCount;
  int workGroupSize;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SharedVarTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar2 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar3 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_localSize);
  iVar4 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_workSize);
  buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((long)iVar3 * (long)iVar4 * 4);
  makeBufferCreateInfo
            (&local_b8,
             (VkDeviceSize)
             buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_80,vk_00,device_00,allocator_00,&local_b8,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_168);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_168,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_120,this_00,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_100,(Move *)&local_120);
  data.deleter.m_deviceIface._0_4_ = (int)local_100.deleter.m_deviceIface;
  data.object.m_internal = local_100.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_100.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_100.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_100.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_100.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_e0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_120);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_168);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_1d8,this_01,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1b8.deleter.m_deviceIface;
  data_00.object.m_internal = local_1b8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_1b8.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_1b8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_198,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_1d8);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_198);
  descriptorPool_00.m_internal = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_e0);
  descriptorInfo.range = pHVar9->m_internal;
  makeDescriptorSet(&local_250,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)descriptorInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_230,(Move *)&local_250);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_230.deleter.m_deviceIface;
  data_01.object.m_internal = local_230.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_230.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_230.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_230.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_230.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_210,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_250);
  pVVar10 = compute::Buffer::operator*((Buffer *)local_80);
  local_280 = pVVar10->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_278,(VkBuffer)local_280,0,
             (VkDeviceSize)
             buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_2c8);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_210);
  destSet.m_internal = pHVar11->m_internal;
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_2c8,destSet,
                       (Location *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_278);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_2c8);
  this_03 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"comp",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_03,&local_358);
  ::vk::createShaderModule(&local_338,vk_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_318,(Move *)&local_338);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_318.deleter.m_deviceIface;
  data_02.object.m_internal = local_318.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_318.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_318.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_318.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_318.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2f8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_e0);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar9->m_internal;
  makePipelineLayout(&local_3c0,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3a0,(Move *)&local_3c0);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_3a0.deleter.m_deviceIface;
  data_03.object.m_internal = local_3a0.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3a0.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_3a0.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_3a0.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_3a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_380,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_3c0);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_380);
  pipelineLayout_00.m_internal = pHVar12->m_internal;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_2f8);
  computeFinishBarrier.size = pHVar13->m_internal;
  makeComputePipeline(&local_428,vk_00,device_00,pipelineLayout_00,
                      (VkShaderModule)computeFinishBarrier.size);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_408,(Move *)&local_428);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_408.deleter.m_deviceIface;
  data_04.object.m_internal = local_408.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_408.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_408.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_408.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_408.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3e8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_428);
  pVVar10 = compute::Buffer::operator*((Buffer *)local_80);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar10->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_470,0x40,0x2000,
             (VkBuffer)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0,
             (VkDeviceSize)
             buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,dVar2);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4b8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_4b8.deleter.m_deviceIface;
  data_05.object.m_internal = local_4b8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4b8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_4b8.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_4b8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_4b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_498,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_498);
  local_540 = pHVar14->m_internal;
  ::vk::allocateCommandBuffer
            (&local_538,vk_00,device_00,(VkCommandPool)local_540,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_518,(Move *)&local_538);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_518.deleter.m_deviceIface;
  data_06.object = local_518.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_518.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_518.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_518.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_518.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_4f8,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_538);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  beginCommandBuffer(vk_00,*ppVVar15);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  pVVar1 = *ppVVar15;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_3e8);
  local_548 = pHVar16->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,1,local_548);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  pVVar1 = *ppVVar15;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_380);
  bufferAllocation = (Allocation *)pHVar12->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_210);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,1,bufferAllocation,0,1,pHVar11,0,0);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  pVVar1 = *ppVVar15;
  this_04 = &this->m_workSize;
  uVar5 = tcu::Vector<int,_3>::x(this_04);
  uVar6 = tcu::Vector<int,_3>::y(this_04);
  uVar7 = tcu::Vector<int,_3>::z(this_04);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar1,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar15,0x800,0x4000,0,0,0,1,local_470,0,0);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  endCommandBuffer(vk_00,*ppVVar15);
  ppVVar15 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4f8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar15);
  local_558 = compute::Buffer::getAllocation((Buffer *)local_80);
  bufferPtr = (deUint32 *)::vk::Allocation::getMemory(local_558);
  offset = ::vk::Allocation::getOffset(local_558);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,(VkDeviceMemory)bufferPtr,offset,
             (VkDeviceSize)
             buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  _globalOffset = ::vk::Allocation::getHostPtr(local_558);
  localOffset = 0;
  do {
    if (iVar4 <= localOffset) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_740,"Compute succeeded",&local_741);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_740);
      std::__cxx11::string::~string((string *)&local_740);
      std::allocator<char>::~allocator(&local_741);
      local_71c = 1;
LAB_00cf0f4f:
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_4f8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_498);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3e8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_380);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_2f8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_210);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_198);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_e0);
      compute::Buffer::~Buffer((Buffer *)local_80);
      return __return_storage_ptr__;
    }
    res = localOffset * iVar3;
    for (ref = 0; dVar2 = res, (int)ref < iVar3; ref = ref + 1) {
      local_578 = *(int *)((long)_globalOffset + (long)(int)(res + ref) * 4);
      local_580 = ~ref + iVar3;
      local_57c = squared<int>(&local_580);
      local_57c = dVar2 + local_57c;
      if (local_578 != local_57c) {
        std::__cxx11::ostringstream::ostringstream(local_6f8);
        poVar17 = std::operator<<((ostream *)local_6f8,"Comparison failed for Output.values[");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,res + ref);
        std::operator<<(poVar17,"]");
        std::__cxx11::ostringstream::str();
        tcu::TestStatus::fail(__return_storage_ptr__,&local_718);
        std::__cxx11::string::~string((string *)&local_718);
        local_71c = 1;
        std::__cxx11::ostringstream::~ostringstream(local_6f8);
        goto LAB_00cf0f4f;
      }
    }
    localOffset = localOffset + 1;
  } while( true );
}

Assistant:

tcu::TestStatus SharedVarTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int workGroupSize = multiplyComponents(m_localSize);
	const int workGroupCount = multiplyComponents(m_workSize);

	// Create a buffer and host-visible memory for it

	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * workGroupSize * workGroupCount;
	const Buffer buffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*buffer, 0ull, bufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const VkBufferMemoryBarrier computeFinishBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *buffer, 0ull, bufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &computeFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& bufferAllocation = buffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(bufferAllocation.getHostPtr());

	for (int groupNdx = 0; groupNdx < workGroupCount; ++groupNdx)
	{
		const int globalOffset = groupNdx * workGroupSize;
		for (int localOffset = 0; localOffset < workGroupSize; ++localOffset)
		{
			const deUint32 res = bufferPtr[globalOffset + localOffset];
			const deUint32 ref = globalOffset + squared(workGroupSize - localOffset - 1);

			if (res != ref)
			{
				std::ostringstream msg;
				msg << "Comparison failed for Output.values[" << (globalOffset + localOffset) << "]";
				return tcu::TestStatus::fail(msg.str());
			}
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}